

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gen.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
rc::Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator*
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  ValueType pGVar1;
  ValueType *ppGVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  _func_Any_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **in_RCX;
  undefined1 local_a8 [48];
  Gen<rc::detail::Any> local_78;
  Gen<rc::detail::Any> local_50;
  Any local_28;
  ValueType local_20;
  ValueType handler;
  Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_local;
  
  handler = (ValueType)this;
  this_local = (Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__return_storage_ptr__;
  ppGVar2 = rc::detail::ImplicitParam<rc::gen::detail::param::CurrentHandler>::value();
  pGVar1 = *ppGVar2;
  local_20 = pGVar1;
  Gen((Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
      (local_a8 + 8),this);
  local_a8._0_8_ = rc::detail::Any::of<std::__cxx11::string>;
  rc::gen::map<std::__cxx11::string,rc::detail::Any(*)(std::__cxx11::string&&)>
            (&local_78,(gen *)(local_a8 + 8),
             (Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_a8,in_RCX);
  Gen<rc::detail::Any>::as(&local_50,&local_78,&this->m_name);
  (**pGVar1->_vptr_GenerationHandler)(&local_28,pGVar1,&local_50);
  pbVar3 = rc::detail::Any::get<std::__cxx11::string>(&local_28);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar3);
  rc::detail::Any::~Any(&local_28);
  Gen<rc::detail::Any>::~Gen(&local_50);
  Gen<rc::detail::Any>::~Gen(&local_78);
  ~Gen((Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
       (local_a8 + 8));
  return __return_storage_ptr__;
}

Assistant:

T Gen<T>::operator*() const {
  using namespace detail;
  using rc::gen::detail::param::CurrentHandler;
  const auto handler = ImplicitParam<CurrentHandler>::value();
  return std::move(handler->onGenerate(gen::map(*this, &Any::of<T>).as(m_name))
                       .template get<T>());
}